

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

size_t __thiscall CoreML::Specification::NeuralNetworkLayer::ByteSizeLong(NeuralNetworkLayer *this)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  LayerCase LVar4;
  string *psVar5;
  size_t sVar6;
  Tensor *pTVar7;
  long lVar8;
  uint local_38;
  int cached_size;
  uint i_3;
  uint count_1;
  uint i_2;
  uint count;
  int n_1;
  int i_1;
  int n;
  int i;
  size_t total_size;
  NeuralNetworkLayer *this_local;
  
  iVar2 = input_size(this);
  _n = google::protobuf::internal::FromIntSize(iVar2);
  i_1 = 0;
  iVar2 = input_size(this);
  for (; i_1 < iVar2; i_1 = i_1 + 1) {
    psVar5 = input_abi_cxx11_(this,i_1);
    sVar6 = google::protobuf::internal::WireFormatLite::StringSize(psVar5);
    _n = sVar6 + _n;
  }
  iVar2 = output_size(this);
  sVar6 = google::protobuf::internal::FromIntSize(iVar2);
  _n = sVar6 + _n;
  count = 0;
  iVar2 = output_size(this);
  for (; (int)count < iVar2; count = count + 1) {
    psVar5 = output_abi_cxx11_(this,count);
    sVar6 = google::protobuf::internal::WireFormatLite::StringSize(psVar5);
    _n = sVar6 + _n;
  }
  uVar3 = inputtensor_size(this);
  _n = uVar3 + _n;
  for (i_3 = 0; i_3 < uVar3; i_3 = i_3 + 1) {
    pTVar7 = inputtensor(this,i_3);
    sVar6 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::Tensor>(pTVar7);
    _n = sVar6 + _n;
  }
  uVar3 = outputtensor_size(this);
  _n = uVar3 + _n;
  for (local_38 = 0; local_38 < uVar3; local_38 = local_38 + 1) {
    pTVar7 = outputtensor(this,local_38);
    sVar6 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::Tensor>(pTVar7);
    _n = sVar6 + _n;
  }
  name_abi_cxx11_(this);
  lVar8 = std::__cxx11::string::size();
  if (lVar8 != 0) {
    psVar5 = name_abi_cxx11_(this);
    sVar6 = google::protobuf::internal::WireFormatLite::StringSize(psVar5);
    _n = sVar6 + 1 + _n;
  }
  bVar1 = isupdatable(this);
  if (bVar1) {
    _n = _n + 2;
  }
  LVar4 = layer_case(this);
  if (LVar4 < 0x5c0) {
    sVar6 = (*(code *)(&DAT_00b96828 + *(int *)(&DAT_00b96828 + (ulong)LVar4 * 4)))();
    return sVar6;
  }
  iVar2 = google::protobuf::internal::ToCachedSize(_n);
  this->_cached_size_ = iVar2;
  return _n;
}

Assistant:

size_t NeuralNetworkLayer::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.NeuralNetworkLayer)
  size_t total_size = 0;

  // repeated string input = 2;
  total_size += 1 *
      ::google::protobuf::internal::FromIntSize(this->input_size());
  for (int i = 0, n = this->input_size(); i < n; i++) {
    total_size += ::google::protobuf::internal::WireFormatLite::StringSize(
      this->input(i));
  }

  // repeated string output = 3;
  total_size += 1 *
      ::google::protobuf::internal::FromIntSize(this->output_size());
  for (int i = 0, n = this->output_size(); i < n; i++) {
    total_size += ::google::protobuf::internal::WireFormatLite::StringSize(
      this->output(i));
  }

  // repeated .CoreML.Specification.Tensor inputTensor = 4;
  {
    unsigned int count = this->inputtensor_size();
    total_size += 1UL * count;
    for (unsigned int i = 0; i < count; i++) {
      total_size +=
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          this->inputtensor(i));
    }
  }

  // repeated .CoreML.Specification.Tensor outputTensor = 5;
  {
    unsigned int count = this->outputtensor_size();
    total_size += 1UL * count;
    for (unsigned int i = 0; i < count; i++) {
      total_size +=
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          this->outputtensor(i));
    }
  }

  // string name = 1;
  if (this->name().size() > 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::StringSize(
        this->name());
  }

  // bool isUpdatable = 10;
  if (this->isupdatable() != 0) {
    total_size += 1 + 1;
  }

  switch (layer_case()) {
    // .CoreML.Specification.ConvolutionLayerParams convolution = 100;
    case kConvolution: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.convolution_);
      break;
    }
    // .CoreML.Specification.PoolingLayerParams pooling = 120;
    case kPooling: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.pooling_);
      break;
    }
    // .CoreML.Specification.ActivationParams activation = 130;
    case kActivation: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.activation_);
      break;
    }
    // .CoreML.Specification.InnerProductLayerParams innerProduct = 140;
    case kInnerProduct: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.innerproduct_);
      break;
    }
    // .CoreML.Specification.EmbeddingLayerParams embedding = 150;
    case kEmbedding: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.embedding_);
      break;
    }
    // .CoreML.Specification.BatchnormLayerParams batchnorm = 160;
    case kBatchnorm: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.batchnorm_);
      break;
    }
    // .CoreML.Specification.MeanVarianceNormalizeLayerParams mvn = 165;
    case kMvn: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.mvn_);
      break;
    }
    // .CoreML.Specification.L2NormalizeLayerParams l2normalize = 170;
    case kL2Normalize: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.l2normalize_);
      break;
    }
    // .CoreML.Specification.SoftmaxLayerParams softmax = 175;
    case kSoftmax: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.softmax_);
      break;
    }
    // .CoreML.Specification.LRNLayerParams lrn = 180;
    case kLrn: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.lrn_);
      break;
    }
    // .CoreML.Specification.CropLayerParams crop = 190;
    case kCrop: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.crop_);
      break;
    }
    // .CoreML.Specification.PaddingLayerParams padding = 200;
    case kPadding: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.padding_);
      break;
    }
    // .CoreML.Specification.UpsampleLayerParams upsample = 210;
    case kUpsample: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.upsample_);
      break;
    }
    // .CoreML.Specification.ResizeBilinearLayerParams resizeBilinear = 211;
    case kResizeBilinear: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.resizebilinear_);
      break;
    }
    // .CoreML.Specification.CropResizeLayerParams cropResize = 212;
    case kCropResize: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.cropresize_);
      break;
    }
    // .CoreML.Specification.UnaryFunctionLayerParams unary = 220;
    case kUnary: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.unary_);
      break;
    }
    // .CoreML.Specification.AddLayerParams add = 230;
    case kAdd: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.add_);
      break;
    }
    // .CoreML.Specification.MultiplyLayerParams multiply = 231;
    case kMultiply: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.multiply_);
      break;
    }
    // .CoreML.Specification.AverageLayerParams average = 240;
    case kAverage: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.average_);
      break;
    }
    // .CoreML.Specification.ScaleLayerParams scale = 245;
    case kScale: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.scale_);
      break;
    }
    // .CoreML.Specification.BiasLayerParams bias = 250;
    case kBias: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.bias_);
      break;
    }
    // .CoreML.Specification.MaxLayerParams max = 260;
    case kMax: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.max_);
      break;
    }
    // .CoreML.Specification.MinLayerParams min = 261;
    case kMin: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.min_);
      break;
    }
    // .CoreML.Specification.DotProductLayerParams dot = 270;
    case kDot: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.dot_);
      break;
    }
    // .CoreML.Specification.ReduceLayerParams reduce = 280;
    case kReduce: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.reduce_);
      break;
    }
    // .CoreML.Specification.LoadConstantLayerParams loadConstant = 290;
    case kLoadConstant: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.loadconstant_);
      break;
    }
    // .CoreML.Specification.ReshapeLayerParams reshape = 300;
    case kReshape: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.reshape_);
      break;
    }
    // .CoreML.Specification.FlattenLayerParams flatten = 301;
    case kFlatten: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.flatten_);
      break;
    }
    // .CoreML.Specification.PermuteLayerParams permute = 310;
    case kPermute: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.permute_);
      break;
    }
    // .CoreML.Specification.ConcatLayerParams concat = 320;
    case kConcat: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.concat_);
      break;
    }
    // .CoreML.Specification.SplitLayerParams split = 330;
    case kSplit: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.split_);
      break;
    }
    // .CoreML.Specification.SequenceRepeatLayerParams sequenceRepeat = 340;
    case kSequenceRepeat: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.sequencerepeat_);
      break;
    }
    // .CoreML.Specification.ReorganizeDataLayerParams reorganizeData = 345;
    case kReorganizeData: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.reorganizedata_);
      break;
    }
    // .CoreML.Specification.SliceLayerParams slice = 350;
    case kSlice: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.slice_);
      break;
    }
    // .CoreML.Specification.SimpleRecurrentLayerParams simpleRecurrent = 400;
    case kSimpleRecurrent: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.simplerecurrent_);
      break;
    }
    // .CoreML.Specification.GRULayerParams gru = 410;
    case kGru: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.gru_);
      break;
    }
    // .CoreML.Specification.UniDirectionalLSTMLayerParams uniDirectionalLSTM = 420;
    case kUniDirectionalLSTM: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.unidirectionallstm_);
      break;
    }
    // .CoreML.Specification.BiDirectionalLSTMLayerParams biDirectionalLSTM = 430;
    case kBiDirectionalLSTM: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.bidirectionallstm_);
      break;
    }
    // .CoreML.Specification.CustomLayerParams custom = 500;
    case kCustom: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.custom_);
      break;
    }
    // .CoreML.Specification.CopyLayerParams copy = 600;
    case kCopy: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.copy_);
      break;
    }
    // .CoreML.Specification.BranchLayerParams branch = 605;
    case kBranch: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.branch_);
      break;
    }
    // .CoreML.Specification.LoopLayerParams loop = 615;
    case kLoop: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.loop_);
      break;
    }
    // .CoreML.Specification.LoopBreakLayerParams loopBreak = 620;
    case kLoopBreak: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.loopbreak_);
      break;
    }
    // .CoreML.Specification.LoopContinueLayerParams loopContinue = 625;
    case kLoopContinue: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.loopcontinue_);
      break;
    }
    // .CoreML.Specification.RangeStaticLayerParams rangeStatic = 635;
    case kRangeStatic: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.rangestatic_);
      break;
    }
    // .CoreML.Specification.RangeDynamicLayerParams rangeDynamic = 640;
    case kRangeDynamic: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.rangedynamic_);
      break;
    }
    // .CoreML.Specification.ClipLayerParams clip = 660;
    case kClip: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.clip_);
      break;
    }
    // .CoreML.Specification.CeilLayerParams ceil = 665;
    case kCeil: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.ceil_);
      break;
    }
    // .CoreML.Specification.FloorLayerParams floor = 670;
    case kFloor: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.floor_);
      break;
    }
    // .CoreML.Specification.SignLayerParams sign = 680;
    case kSign: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.sign_);
      break;
    }
    // .CoreML.Specification.RoundLayerParams round = 685;
    case kRound: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.round_);
      break;
    }
    // .CoreML.Specification.Exp2LayerParams exp2 = 700;
    case kExp2: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.exp2_);
      break;
    }
    // .CoreML.Specification.SinLayerParams sin = 710;
    case kSin: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.sin_);
      break;
    }
    // .CoreML.Specification.CosLayerParams cos = 715;
    case kCos: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.cos_);
      break;
    }
    // .CoreML.Specification.TanLayerParams tan = 720;
    case kTan: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.tan_);
      break;
    }
    // .CoreML.Specification.AsinLayerParams asin = 730;
    case kAsin: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.asin_);
      break;
    }
    // .CoreML.Specification.AcosLayerParams acos = 735;
    case kAcos: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.acos_);
      break;
    }
    // .CoreML.Specification.AtanLayerParams atan = 740;
    case kAtan: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.atan_);
      break;
    }
    // .CoreML.Specification.SinhLayerParams sinh = 750;
    case kSinh: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.sinh_);
      break;
    }
    // .CoreML.Specification.CoshLayerParams cosh = 755;
    case kCosh: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.cosh_);
      break;
    }
    // .CoreML.Specification.TanhLayerParams tanh = 760;
    case kTanh: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.tanh_);
      break;
    }
    // .CoreML.Specification.AsinhLayerParams asinh = 770;
    case kAsinh: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.asinh_);
      break;
    }
    // .CoreML.Specification.AcoshLayerParams acosh = 775;
    case kAcosh: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.acosh_);
      break;
    }
    // .CoreML.Specification.AtanhLayerParams atanh = 780;
    case kAtanh: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.atanh_);
      break;
    }
    // .CoreML.Specification.ErfLayerParams erf = 790;
    case kErf: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.erf_);
      break;
    }
    // .CoreML.Specification.GeluLayerParams gelu = 795;
    case kGelu: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.gelu_);
      break;
    }
    // .CoreML.Specification.EqualLayerParams equal = 815;
    case kEqual: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.equal_);
      break;
    }
    // .CoreML.Specification.NotEqualLayerParams notEqual = 820;
    case kNotEqual: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.notequal_);
      break;
    }
    // .CoreML.Specification.LessThanLayerParams lessThan = 825;
    case kLessThan: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.lessthan_);
      break;
    }
    // .CoreML.Specification.LessEqualLayerParams lessEqual = 827;
    case kLessEqual: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.lessequal_);
      break;
    }
    // .CoreML.Specification.GreaterThanLayerParams greaterThan = 830;
    case kGreaterThan: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.greaterthan_);
      break;
    }
    // .CoreML.Specification.GreaterEqualLayerParams greaterEqual = 832;
    case kGreaterEqual: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.greaterequal_);
      break;
    }
    // .CoreML.Specification.LogicalOrLayerParams logicalOr = 840;
    case kLogicalOr: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.logicalor_);
      break;
    }
    // .CoreML.Specification.LogicalXorLayerParams logicalXor = 845;
    case kLogicalXor: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.logicalxor_);
      break;
    }
    // .CoreML.Specification.LogicalNotLayerParams logicalNot = 850;
    case kLogicalNot: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.logicalnot_);
      break;
    }
    // .CoreML.Specification.LogicalAndLayerParams logicalAnd = 855;
    case kLogicalAnd: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.logicaland_);
      break;
    }
    // .CoreML.Specification.ModBroadcastableLayerParams modBroadcastable = 865;
    case kModBroadcastable: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.modbroadcastable_);
      break;
    }
    // .CoreML.Specification.MinBroadcastableLayerParams minBroadcastable = 870;
    case kMinBroadcastable: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.minbroadcastable_);
      break;
    }
    // .CoreML.Specification.MaxBroadcastableLayerParams maxBroadcastable = 875;
    case kMaxBroadcastable: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.maxbroadcastable_);
      break;
    }
    // .CoreML.Specification.AddBroadcastableLayerParams addBroadcastable = 880;
    case kAddBroadcastable: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.addbroadcastable_);
      break;
    }
    // .CoreML.Specification.PowBroadcastableLayerParams powBroadcastable = 885;
    case kPowBroadcastable: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.powbroadcastable_);
      break;
    }
    // .CoreML.Specification.DivideBroadcastableLayerParams divideBroadcastable = 890;
    case kDivideBroadcastable: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.dividebroadcastable_);
      break;
    }
    // .CoreML.Specification.FloorDivBroadcastableLayerParams floorDivBroadcastable = 895;
    case kFloorDivBroadcastable: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.floordivbroadcastable_);
      break;
    }
    // .CoreML.Specification.MultiplyBroadcastableLayerParams multiplyBroadcastable = 900;
    case kMultiplyBroadcastable: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.multiplybroadcastable_);
      break;
    }
    // .CoreML.Specification.SubtractBroadcastableLayerParams subtractBroadcastable = 905;
    case kSubtractBroadcastable: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.subtractbroadcastable_);
      break;
    }
    // .CoreML.Specification.TileLayerParams tile = 920;
    case kTile: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.tile_);
      break;
    }
    // .CoreML.Specification.StackLayerParams stack = 925;
    case kStack: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.stack_);
      break;
    }
    // .CoreML.Specification.GatherLayerParams gather = 930;
    case kGather: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.gather_);
      break;
    }
    // .CoreML.Specification.ScatterLayerParams scatter = 935;
    case kScatter: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.scatter_);
      break;
    }
    // .CoreML.Specification.GatherNDLayerParams gatherND = 940;
    case kGatherND: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.gathernd_);
      break;
    }
    // .CoreML.Specification.ScatterNDLayerParams scatterND = 945;
    case kScatterND: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.scatternd_);
      break;
    }
    // .CoreML.Specification.SoftmaxNDLayerParams softmaxND = 950;
    case kSoftmaxND: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.softmaxnd_);
      break;
    }
    // .CoreML.Specification.GatherAlongAxisLayerParams gatherAlongAxis = 952;
    case kGatherAlongAxis: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.gatheralongaxis_);
      break;
    }
    // .CoreML.Specification.ScatterAlongAxisLayerParams scatterAlongAxis = 954;
    case kScatterAlongAxis: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.scatteralongaxis_);
      break;
    }
    // .CoreML.Specification.ReverseLayerParams reverse = 960;
    case kReverse: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.reverse_);
      break;
    }
    // .CoreML.Specification.ReverseSeqLayerParams reverseSeq = 965;
    case kReverseSeq: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.reverseseq_);
      break;
    }
    // .CoreML.Specification.SplitNDLayerParams splitND = 975;
    case kSplitND: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.splitnd_);
      break;
    }
    // .CoreML.Specification.ConcatNDLayerParams concatND = 980;
    case kConcatND: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.concatnd_);
      break;
    }
    // .CoreML.Specification.TransposeLayerParams transpose = 985;
    case kTranspose: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.transpose_);
      break;
    }
    // .CoreML.Specification.SliceStaticLayerParams sliceStatic = 995;
    case kSliceStatic: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.slicestatic_);
      break;
    }
    // .CoreML.Specification.SliceDynamicLayerParams sliceDynamic = 1000;
    case kSliceDynamic: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.slicedynamic_);
      break;
    }
    // .CoreML.Specification.SlidingWindowsLayerParams slidingWindows = 1005;
    case kSlidingWindows: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.slidingwindows_);
      break;
    }
    // .CoreML.Specification.TopKLayerParams topK = 1015;
    case kTopK: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.topk_);
      break;
    }
    // .CoreML.Specification.ArgMinLayerParams argMin = 1020;
    case kArgMin: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.argmin_);
      break;
    }
    // .CoreML.Specification.ArgMaxLayerParams argMax = 1025;
    case kArgMax: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.argmax_);
      break;
    }
    // .CoreML.Specification.EmbeddingNDLayerParams embeddingND = 1040;
    case kEmbeddingND: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.embeddingnd_);
      break;
    }
    // .CoreML.Specification.BatchedMatMulLayerParams batchedMatmul = 1045;
    case kBatchedMatmul: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.batchedmatmul_);
      break;
    }
    // .CoreML.Specification.GetShapeLayerParams getShape = 1065;
    case kGetShape: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.getshape_);
      break;
    }
    // .CoreML.Specification.LoadConstantNDLayerParams loadConstantND = 1070;
    case kLoadConstantND: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.loadconstantnd_);
      break;
    }
    // .CoreML.Specification.FillLikeLayerParams fillLike = 1080;
    case kFillLike: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.filllike_);
      break;
    }
    // .CoreML.Specification.FillStaticLayerParams fillStatic = 1085;
    case kFillStatic: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.fillstatic_);
      break;
    }
    // .CoreML.Specification.FillDynamicLayerParams fillDynamic = 1090;
    case kFillDynamic: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.filldynamic_);
      break;
    }
    // .CoreML.Specification.BroadcastToLikeLayerParams broadcastToLike = 1100;
    case kBroadcastToLike: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.broadcasttolike_);
      break;
    }
    // .CoreML.Specification.BroadcastToStaticLayerParams broadcastToStatic = 1105;
    case kBroadcastToStatic: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.broadcasttostatic_);
      break;
    }
    // .CoreML.Specification.BroadcastToDynamicLayerParams broadcastToDynamic = 1110;
    case kBroadcastToDynamic: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.broadcasttodynamic_);
      break;
    }
    // .CoreML.Specification.SqueezeLayerParams squeeze = 1120;
    case kSqueeze: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.squeeze_);
      break;
    }
    // .CoreML.Specification.ExpandDimsLayerParams expandDims = 1125;
    case kExpandDims: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.expanddims_);
      break;
    }
    // .CoreML.Specification.FlattenTo2DLayerParams flattenTo2D = 1130;
    case kFlattenTo2D: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.flattento2d_);
      break;
    }
    // .CoreML.Specification.ReshapeLikeLayerParams reshapeLike = 1135;
    case kReshapeLike: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.reshapelike_);
      break;
    }
    // .CoreML.Specification.ReshapeStaticLayerParams reshapeStatic = 1140;
    case kReshapeStatic: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.reshapestatic_);
      break;
    }
    // .CoreML.Specification.ReshapeDynamicLayerParams reshapeDynamic = 1145;
    case kReshapeDynamic: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.reshapedynamic_);
      break;
    }
    // .CoreML.Specification.RankPreservingReshapeLayerParams rankPreservingReshape = 1150;
    case kRankPreservingReshape: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.rankpreservingreshape_);
      break;
    }
    // .CoreML.Specification.ConstantPaddingLayerParams constantPad = 1155;
    case kConstantPad: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.constantpad_);
      break;
    }
    // .CoreML.Specification.RandomNormalLikeLayerParams randomNormalLike = 1170;
    case kRandomNormalLike: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.randomnormallike_);
      break;
    }
    // .CoreML.Specification.RandomNormalStaticLayerParams randomNormalStatic = 1175;
    case kRandomNormalStatic: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.randomnormalstatic_);
      break;
    }
    // .CoreML.Specification.RandomNormalDynamicLayerParams randomNormalDynamic = 1180;
    case kRandomNormalDynamic: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.randomnormaldynamic_);
      break;
    }
    // .CoreML.Specification.RandomUniformLikeLayerParams randomUniformLike = 1190;
    case kRandomUniformLike: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.randomuniformlike_);
      break;
    }
    // .CoreML.Specification.RandomUniformStaticLayerParams randomUniformStatic = 1195;
    case kRandomUniformStatic: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.randomuniformstatic_);
      break;
    }
    // .CoreML.Specification.RandomUniformDynamicLayerParams randomUniformDynamic = 1200;
    case kRandomUniformDynamic: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.randomuniformdynamic_);
      break;
    }
    // .CoreML.Specification.RandomBernoulliLikeLayerParams randomBernoulliLike = 1210;
    case kRandomBernoulliLike: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.randombernoullilike_);
      break;
    }
    // .CoreML.Specification.RandomBernoulliStaticLayerParams randomBernoulliStatic = 1215;
    case kRandomBernoulliStatic: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.randombernoullistatic_);
      break;
    }
    // .CoreML.Specification.RandomBernoulliDynamicLayerParams randomBernoulliDynamic = 1220;
    case kRandomBernoulliDynamic: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.randombernoullidynamic_);
      break;
    }
    // .CoreML.Specification.CategoricalDistributionLayerParams categoricalDistribution = 1230;
    case kCategoricalDistribution: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.categoricaldistribution_);
      break;
    }
    // .CoreML.Specification.ReduceL1LayerParams reduceL1 = 1250;
    case kReduceL1: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.reducel1_);
      break;
    }
    // .CoreML.Specification.ReduceL2LayerParams reduceL2 = 1255;
    case kReduceL2: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.reducel2_);
      break;
    }
    // .CoreML.Specification.ReduceMaxLayerParams reduceMax = 1260;
    case kReduceMax: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.reducemax_);
      break;
    }
    // .CoreML.Specification.ReduceMinLayerParams reduceMin = 1265;
    case kReduceMin: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.reducemin_);
      break;
    }
    // .CoreML.Specification.ReduceSumLayerParams reduceSum = 1270;
    case kReduceSum: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.reducesum_);
      break;
    }
    // .CoreML.Specification.ReduceProdLayerParams reduceProd = 1275;
    case kReduceProd: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.reduceprod_);
      break;
    }
    // .CoreML.Specification.ReduceMeanLayerParams reduceMean = 1280;
    case kReduceMean: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.reducemean_);
      break;
    }
    // .CoreML.Specification.ReduceLogSumLayerParams reduceLogSum = 1285;
    case kReduceLogSum: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.reducelogsum_);
      break;
    }
    // .CoreML.Specification.ReduceSumSquareLayerParams reduceSumSquare = 1290;
    case kReduceSumSquare: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.reducesumsquare_);
      break;
    }
    // .CoreML.Specification.ReduceLogSumExpLayerParams reduceLogSumExp = 1295;
    case kReduceLogSumExp: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.reducelogsumexp_);
      break;
    }
    // .CoreML.Specification.WhereNonZeroLayerParams whereNonZero = 1313;
    case kWhereNonZero: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.wherenonzero_);
      break;
    }
    // .CoreML.Specification.MatrixBandPartLayerParams matrixBandPart = 1315;
    case kMatrixBandPart: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.matrixbandpart_);
      break;
    }
    // .CoreML.Specification.LowerTriangularLayerParams lowerTriangular = 1320;
    case kLowerTriangular: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.lowertriangular_);
      break;
    }
    // .CoreML.Specification.UpperTriangularLayerParams upperTriangular = 1325;
    case kUpperTriangular: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.uppertriangular_);
      break;
    }
    // .CoreML.Specification.WhereBroadcastableLayerParams whereBroadcastable = 1330;
    case kWhereBroadcastable: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.wherebroadcastable_);
      break;
    }
    // .CoreML.Specification.LayerNormalizationLayerParams layerNormalization = 1350;
    case kLayerNormalization: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.layernormalization_);
      break;
    }
    // .CoreML.Specification.NonMaximumSuppressionLayerParams NonMaximumSuppression = 1400;
    case kNonMaximumSuppression: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.nonmaximumsuppression_);
      break;
    }
    // .CoreML.Specification.OneHotLayerParams oneHot = 1450;
    case kOneHot: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.onehot_);
      break;
    }
    // .CoreML.Specification.CumSumLayerParams cumSum = 1455;
    case kCumSum: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.cumsum_);
      break;
    }
    // .CoreML.Specification.ClampedReLULayerParams clampedReLU = 1460;
    case kClampedReLU: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.clampedrelu_);
      break;
    }
    // .CoreML.Specification.ArgSortLayerParams argSort = 1461;
    case kArgSort: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.argsort_);
      break;
    }
    // .CoreML.Specification.Pooling3DLayerParams pooling3d = 1465;
    case kPooling3D: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.pooling3d_);
      break;
    }
    // .CoreML.Specification.GlobalPooling3DLayerParams globalPooling3d = 1466;
    case kGlobalPooling3D: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.globalpooling3d_);
      break;
    }
    // .CoreML.Specification.SliceBySizeLayerParams sliceBySize = 1470;
    case kSliceBySize: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.slicebysize_);
      break;
    }
    // .CoreML.Specification.Convolution3DLayerParams convolution3d = 1471;
    case kConvolution3D: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.convolution3d_);
      break;
    }
    case LAYER_NOT_SET: {
      break;
    }
  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}